

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall phosg::StringReader::preadx(StringReader *this,size_t offset,void *data,size_t size)

{
  out_of_range *this_00;
  size_t size_local;
  void *data_local;
  size_t offset_local;
  StringReader *this_local;
  
  if ((offset < this->length) && (offset + size <= this->length)) {
    memcpy(data,this->data + offset,size);
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"not enough data to read");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void StringReader::preadx(size_t offset, void* data, size_t size) const {
  if ((offset >= this->length) || (offset + size > this->length)) {
    throw out_of_range("not enough data to read");
  }
  memcpy(data, this->data + offset, size);
}